

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<std::basic_string_view<char,std::char_traits<char>>,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,void *this,string_view str)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  string_view str_local;
  
  str_local._M_len = str._M_len;
  local_20 = (undefined1  [8])this;
  str_local._M_str = (char *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_40,(basic_string_view<char,_std::char_traits<char>_> *)local_20,&local_41);
  Detail::stringify<std::__cxx11::string>(__return_storage_ptr__,(Detail *)local_40,e);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::string_view>::convert(std::string_view str) {
    return ::Catch::Detail::stringify(std::string{ str });
}